

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

Vector<unsigned_int,_4> __thiscall
tcu::sampleTextureBorder<unsigned_int>(tcu *this,TextureFormat *format,Sampler *sampler)

{
  undefined8 extraout_RDX;
  Vector<unsigned_int,_4> VVar2;
  tcu local_54 [16];
  tcu local_44 [16];
  tcu local_34 [16];
  TextureChannelClass local_24;
  Sampler *pSStack_20;
  TextureChannelClass channelClass;
  Sampler *sampler_local;
  TextureFormat *format_local;
  undefined8 uVar1;
  
  pSStack_20 = sampler;
  sampler_local = (Sampler *)format;
  format_local = (TextureFormat *)this;
  local_24 = getTextureChannelClass(format->type);
  switch(local_24) {
  case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_FLOATING_POINT:
    getTextureBorderColorFloat(local_34,(TextureFormat *)sampler_local,pSStack_20);
    VVar2 = Vector<float,_4>::cast<unsigned_int>((Vector<float,_4> *)this);
    uVar1 = VVar2.m_data._8_8_;
    break;
  case TEXTURECHANNELCLASS_SIGNED_INTEGER:
    getTextureBorderColorInt(local_44,(TextureFormat *)sampler_local,pSStack_20);
    VVar2 = Vector<int,_4>::cast<unsigned_int>((Vector<int,_4> *)this);
    uVar1 = VVar2.m_data._8_8_;
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
    getTextureBorderColorUint(local_54,(TextureFormat *)sampler_local,pSStack_20);
    VVar2 = Vector<unsigned_int,_4>::cast<unsigned_int>((Vector<unsigned_int,_4> *)this);
    uVar1 = VVar2.m_data._8_8_;
    break;
  default:
    Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)this);
    uVar1 = extraout_RDX;
  }
  VVar2.m_data[2] = (int)uVar1;
  VVar2.m_data[3] = (int)((ulong)uVar1 >> 0x20);
  VVar2.m_data._0_8_ = this;
  return (Vector<unsigned_int,_4>)VVar2.m_data;
}

Assistant:

tcu::Vector<ScalarType, 4> sampleTextureBorder (const TextureFormat& format, const Sampler& sampler)
{
	const tcu::TextureChannelClass channelClass = getTextureChannelClass(format.type);

	switch (channelClass)
	{
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
			return getTextureBorderColorFloat(format, sampler).cast<ScalarType>();

		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
			return getTextureBorderColorInt(format, sampler).cast<ScalarType>();

		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
			return getTextureBorderColorUint(format, sampler).cast<ScalarType>();

		default:
			DE_ASSERT(false);
			return tcu::Vector<ScalarType, 4>();
	}
}